

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t zeGetMemExpProcAddrTable(ze_api_version_t version,ze_mem_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_pfnMemGetIpcHandleFromFileDescriptorExp_t p_Var3;
  ze_pfnMemGetFileDescriptorFromIpcHandleExp_t p_Var4;
  ze_pfnMemGetAtomicAccessAttributeExp_t p_Var5;
  ze_result_t zVar6;
  code *pcVar7;
  iterator __begin1;
  undefined8 *puVar8;
  ze_mem_exp_dditable_t dditable;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  puVar8 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 == puVar8) {
LAB_001ae50f:
    zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (pDdiTable == (ze_mem_exp_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    zVar6 = ZE_RESULT_SUCCESS;
    do {
      if ((*(int *)(puVar8 + 1) == 0) &&
         (pcVar7 = (code *)dlsym(*puVar8,"zeGetMemExpProcAddrTable"), pcVar7 != (code *)0x0)) {
        zVar6 = (*pcVar7)(version,puVar8 + 0x85);
      }
      puVar8 = puVar8 + 0x1b3;
    } while (puVar8 != puVar1);
    if (zVar6 != ZE_RESULT_SUCCESS) {
      return zVar6;
    }
    lVar2 = *(long *)(loader::context + 0x15e0);
    if (((ulong)((*(long *)(loader::context + 0x15e8) - lVar2 >> 3) * 0x7aff6957aff6957b) < 2) &&
       (*(char *)(loader::context + 0x1629) != '\x01')) {
      p_Var3 = *(ze_pfnMemGetIpcHandleFromFileDescriptorExp_t *)(lVar2 + 0x428);
      p_Var4 = *(ze_pfnMemGetFileDescriptorFromIpcHandleExp_t *)(lVar2 + 0x430);
      p_Var5 = *(ze_pfnMemGetAtomicAccessAttributeExp_t *)(lVar2 + 0x440);
      pDdiTable->pfnSetAtomicAccessAttributeExp =
           *(ze_pfnMemSetAtomicAccessAttributeExp_t *)(lVar2 + 0x438);
      pDdiTable->pfnGetAtomicAccessAttributeExp = p_Var5;
      pDdiTable->pfnGetIpcHandleFromFileDescriptorExp = p_Var3;
      pDdiTable->pfnGetFileDescriptorFromIpcHandleExp = p_Var4;
    }
    else {
      pDdiTable->pfnGetIpcHandleFromFileDescriptorExp =
           loader::zeMemGetIpcHandleFromFileDescriptorExp;
      pDdiTable->pfnGetFileDescriptorFromIpcHandleExp =
           loader::zeMemGetFileDescriptorFromIpcHandleExp;
      pDdiTable->pfnSetAtomicAccessAttributeExp = loader::zeMemSetAtomicAccessAttributeExp;
      pDdiTable->pfnGetAtomicAccessAttributeExp = loader::zeMemGetAtomicAccessAttributeExp;
    }
    if (*(long *)(loader::context + 0x1618) != 0) {
      pcVar7 = (code *)dlsym(*(long *)(loader::context + 0x1618),"zeGetMemExpProcAddrTable");
      if (pcVar7 == (code *)0x0) goto LAB_001ae50f;
      zVar6 = (*pcVar7)(version,pDdiTable);
      if (zVar6 != ZE_RESULT_SUCCESS) {
        return zVar6;
      }
    }
    if (*(long *)(loader::context + 0x1620) == 0) {
      zVar6 = ZE_RESULT_SUCCESS;
    }
    else {
      pcVar7 = (code *)dlsym(*(long *)(loader::context + 0x1620),"zeGetMemExpProcAddrTable");
      zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
      if (pcVar7 != (code *)0x0) {
        local_58 = *(undefined4 *)&pDdiTable->pfnGetIpcHandleFromFileDescriptorExp;
        uStack_54 = *(undefined4 *)((long)&pDdiTable->pfnGetIpcHandleFromFileDescriptorExp + 4);
        uStack_50 = *(undefined4 *)&pDdiTable->pfnGetFileDescriptorFromIpcHandleExp;
        uStack_4c = *(undefined4 *)((long)&pDdiTable->pfnGetFileDescriptorFromIpcHandleExp + 4);
        local_48 = *(undefined4 *)&pDdiTable->pfnSetAtomicAccessAttributeExp;
        uStack_44 = *(undefined4 *)((long)&pDdiTable->pfnSetAtomicAccessAttributeExp + 4);
        uStack_40 = *(undefined4 *)&pDdiTable->pfnGetAtomicAccessAttributeExp;
        uStack_3c = *(undefined4 *)((long)&pDdiTable->pfnGetAtomicAccessAttributeExp + 4);
        zVar6 = (*pcVar7)(version,&local_58);
        lVar2 = loader::context;
        *(undefined4 *)(loader::context + 0x1a70) = local_58;
        *(undefined4 *)(lVar2 + 0x1a74) = uStack_54;
        *(undefined4 *)(lVar2 + 0x1a78) = uStack_50;
        *(undefined4 *)(lVar2 + 0x1a7c) = uStack_4c;
        *(undefined4 *)(lVar2 + 0x1a80) = local_48;
        *(undefined4 *)(lVar2 + 0x1a84) = uStack_44;
        *(undefined4 *)(lVar2 + 0x1a88) = uStack_40;
        *(undefined4 *)(lVar2 + 0x1a8c) = uStack_3c;
        if (*(char *)(lVar2 + 0x1652) == '\x01') {
          zVar6 = (*pcVar7)(version,pDdiTable);
        }
      }
    }
  }
  return zVar6;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetMemExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_mem_exp_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetMemExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetMemExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.MemExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetIpcHandleFromFileDescriptorExp        = loader::zeMemGetIpcHandleFromFileDescriptorExp;
            pDdiTable->pfnGetFileDescriptorFromIpcHandleExp        = loader::zeMemGetFileDescriptorFromIpcHandleExp;
            pDdiTable->pfnSetAtomicAccessAttributeExp              = loader::zeMemSetAtomicAccessAttributeExp;
            pDdiTable->pfnGetAtomicAccessAttributeExp              = loader::zeMemGetAtomicAccessAttributeExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.MemExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetMemExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetMemExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetMemExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetMemExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_mem_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_mem_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.MemExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}